

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polytri-cli.cc
# Opt level: O2

int main(int argc,char **argv)

{
  pointer pvVar1;
  pointer ptVar2;
  ostream *poVar3;
  istream *piVar4;
  int iVar5;
  uint cid;
  uint uVar6;
  triangle_t *t;
  pointer ptVar7;
  uint i;
  uint uVar8;
  uint ncontours;
  uint npoints;
  vector<vector_t,_std::allocator<vector_t>_> vertices;
  TriangleBuffer_t triangles;
  vector<unsigned_int,_std::allocator<unsigned_int>_> contour_lengths;
  ifstream fd;
  byte abStack_218 [488];
  
  if (argc < 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"usage : ");
    poVar3 = std::operator<<(poVar3,*argv);
    poVar3 = std::operator<<(poVar3," filename.");
    std::endl<char,std::char_traits<char>>(poVar3);
    return 1;
  }
  contour_lengths.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  contour_lengths.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  contour_lengths.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.super__Vector_base<vector_t,_std::allocator<vector_t>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vertices.super__Vector_base<vector_t,_std::allocator<vector_t>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vertices.super__Vector_base<vector_t,_std::allocator<vector_t>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&fd,argv[1],_S_in);
  if ((abStack_218[*(long *)(_fd + -0x18)] & 5) == 0) {
    std::istream::_M_extract<unsigned_int>((uint *)&fd);
    if (ncontours == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Invalid contour count : ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      for (uVar6 = 0; uVar6 < ncontours; uVar6 = uVar6 + 1) {
        std::istream::_M_extract<unsigned_int>((uint *)&fd);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&contour_lengths,&npoints);
        for (uVar8 = 0; uVar8 < npoints; uVar8 = uVar8 + 1) {
          piVar4 = std::istream::_M_extract<double>((double *)&fd);
          std::istream::_M_extract<double>((double *)piVar4);
          std::vector<vector_t,_std::allocator<vector_t>_>::push_back
                    (&vertices,(value_type *)&triangles);
        }
      }
    }
    std::ifstream::~ifstream(&fd);
    if (ncontours != 0) {
      triangles.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      triangles.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      triangles.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      PolygonTriangulation::Triangulate
                ((long)contour_lengths.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)contour_lengths.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2,
                 contour_lengths.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 vertices.super__Vector_base<vector_t,_std::allocator<vector_t>_>._M_impl.
                 super__Vector_impl_data._M_start,&triangles);
      std::ofstream::ofstream
                (&fd,
                 "/workspace/llm4binary/github/license_c_cmakelists/tcoppex[P]polytri/tools/js/data.js"
                 ,_S_out);
      if ((abStack_218[*(long *)(_fd + -0x18)] & 5) != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error : cannot locate the file \"");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/tcoppex[P]polytri/tools/js/data.js"
                                );
        poVar3 = std::operator<<(poVar3,"\"");
        std::endl<char,std::char_traits<char>>(poVar3);
        exit(1);
      }
      poVar3 = std::operator<<((ostream *)&fd,"var TRI = [");
      std::endl<char,std::char_traits<char>>(poVar3);
      ptVar2 = triangles.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (ptVar7 = triangles.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>._M_impl.
                    super__Vector_impl_data._M_start; ptVar7 != ptVar2; ptVar7 = ptVar7 + 1) {
        poVar3 = std::operator<<((ostream *)&fd,"   [ ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,"],");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      poVar3 = std::operator<<((ostream *)&fd,"];");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::endl<char,std::char_traits<char>>((ostream *)&fd);
      poVar3 = std::operator<<((ostream *)&fd,"var vertices = [");
      std::endl<char,std::char_traits<char>>(poVar3);
      for (uVar6 = 0;
          pvVar1 = vertices.super__Vector_base<vector_t,_std::allocator<vector_t>_>._M_impl.
                   super__Vector_impl_data._M_start,
          (ulong)uVar6 <
          (ulong)((long)vertices.super__Vector_base<vector_t,_std::allocator<vector_t>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)vertices.super__Vector_base<vector_t,_std::allocator<vector_t>_>._M_impl.
                        super__Vector_impl_data._M_start >> 4); uVar6 = uVar6 + 1) {
        std::operator<<((ostream *)&fd,"   new TPoint( ");
        poVar3 = std::ostream::_M_insert<double>(pvVar1[uVar6].x);
        std::operator<<(poVar3,", ");
        poVar3 = std::ostream::_M_insert<double>(pvVar1[uVar6].y);
        poVar3 = std::operator<<(poVar3,"),");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      poVar3 = std::operator<<((ostream *)&fd,"];");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::ofstream::~ofstream(&fd);
      std::_Vector_base<triangle_t,_std::allocator<triangle_t>_>::~_Vector_base
                (&triangles.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>);
      iVar5 = 0;
      goto LAB_001036f9;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error : can\'t read the file.");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ifstream::~ifstream(&fd);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"error while reading the data file.");
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar5 = 1;
LAB_001036f9:
  std::_Vector_base<vector_t,_std::allocator<vector_t>_>::~_Vector_base
            (&vertices.super__Vector_base<vector_t,_std::allocator<vector_t>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&contour_lengths.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return iVar5;
}

Assistant:

int main(int argc, char *argv[])
{
  if (argc < 2) {
    std::cerr << "usage : " << argv[0] << " filename." << std::endl;
    return EXIT_FAILURE;
  }

  std::vector<uint32_t> contour_lengths;
  std::vector<vertex_t> vertices;
  if (LoadSegments(argv[1u], contour_lengths, vertices)) {
    std::cerr << "error while reading the data file." << std::endl;
    return EXIT_FAILURE;
  }

  PolygonTriangulation::TriangleBuffer_t triangles;
  PolygonTriangulation::Triangulate(
    contour_lengths.size(),
    contour_lengths.data(),
    vertices.data(),
    triangles
  );

  ExportData(triangles, vertices);

  return EXIT_SUCCESS;
}